

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elu_x86_avx.cpp
# Opt level: O1

int __thiscall
ncnn::ELU_x86_avx::forward_inplace(ELU_x86_avx *this,Mat *bottom_top_blob,Option *opt)

{
  int iVar1;
  _func_int **pp_Var2;
  _func_int *p_Var3;
  int iVar4;
  uint uVar5;
  uint uVar6;
  long lVar7;
  uint uVar8;
  long lVar9;
  undefined1 (*pauVar10) [32];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [32];
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [64];
  undefined1 auVar32 [64];
  undefined1 auVar33 [64];
  undefined1 auVar34 [16];
  
  iVar1 = bottom_top_blob->c;
  if (0 < (long)iVar1) {
    uVar8 = bottom_top_blob->h * bottom_top_blob->w * bottom_top_blob->elempack;
    pp_Var2 = this->_vptr_ELU_x86_avx;
    lVar7 = 0;
    auVar33 = ZEXT3264(CONCAT428(0x3f800000,
                                 CONCAT424(0x3f800000,
                                           CONCAT420(0x3f800000,
                                                     CONCAT416(0x3f800000,
                                                               CONCAT412(0x3f800000,
                                                                         CONCAT48(0x3f800000,
                                                                                  0x3f8000003f800000
                                                                                 )))))));
    auVar31 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
    auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
    do {
      pauVar10 = (undefined1 (*) [32])
                 (bottom_top_blob->cstep * lVar7 * bottom_top_blob->elemsize +
                 (long)bottom_top_blob->data);
      auVar30 = auVar31._0_16_;
      if ((int)uVar8 < 8) {
        uVar6 = 0;
      }
      else {
        fVar11 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        iVar4 = 7;
        do {
          auVar26 = vminps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar10);
          auVar24._8_4_ = 0x42b0c0a5;
          auVar24._0_8_ = 0x42b0c0a542b0c0a5;
          auVar24._12_4_ = 0x42b0c0a5;
          auVar24._16_4_ = 0x42b0c0a5;
          auVar24._20_4_ = 0x42b0c0a5;
          auVar24._24_4_ = 0x42b0c0a5;
          auVar24._28_4_ = 0x42b0c0a5;
          auVar26 = vminps_avx(auVar26,auVar24);
          auVar25._8_4_ = 0xc2b0c0a5;
          auVar25._0_8_ = 0xc2b0c0a5c2b0c0a5;
          auVar25._12_4_ = 0xc2b0c0a5;
          auVar25._16_4_ = 0xc2b0c0a5;
          auVar25._20_4_ = 0xc2b0c0a5;
          auVar25._24_4_ = 0xc2b0c0a5;
          auVar25._28_4_ = 0xc2b0c0a5;
          auVar24 = vmaxps_avx(auVar26,auVar25);
          auVar26._0_4_ = auVar24._0_4_ * 1.442695 + 0.5;
          auVar26._4_4_ = auVar24._4_4_ * 1.442695 + 0.5;
          auVar26._8_4_ = auVar24._8_4_ * 1.442695 + 0.5;
          auVar26._12_4_ = auVar24._12_4_ * 1.442695 + 0.5;
          auVar26._16_4_ = auVar24._16_4_ * 1.442695 + 0.5;
          auVar26._20_4_ = auVar24._20_4_ * 1.442695 + 0.5;
          auVar26._24_4_ = auVar24._24_4_ * 1.442695 + 0.5;
          auVar26._28_4_ = 0x3ff8aa3b;
          auVar13 = vroundps_avx(auVar26,1);
          auVar26 = vcmpps_avx(auVar26,auVar13,1);
          auVar26 = vandps_avx(auVar33._0_32_,auVar26);
          auVar26 = vsubps_avx(auVar13,auVar26);
          fVar14 = auVar24._0_4_ + auVar26._0_4_ * -0.6931472;
          fVar15 = auVar24._4_4_ + auVar26._4_4_ * -0.6931472;
          fVar16 = auVar24._8_4_ + auVar26._8_4_ * -0.6931472;
          fVar17 = auVar24._12_4_ + auVar26._12_4_ * -0.6931472;
          fVar18 = auVar24._16_4_ + auVar26._16_4_ * -0.6931472;
          fVar19 = auVar24._20_4_ + auVar26._20_4_ * -0.6931472;
          fVar20 = auVar24._24_4_ + auVar26._24_4_ * -0.6931472;
          auVar21._0_4_ = (int)auVar26._0_4_;
          auVar21._4_4_ = (int)auVar26._4_4_;
          auVar21._8_4_ = (int)auVar26._8_4_;
          auVar21._12_4_ = (int)auVar26._12_4_;
          auVar27._16_4_ = (int)auVar26._16_4_;
          auVar27._0_16_ = auVar21;
          auVar27._20_4_ = (int)auVar26._20_4_;
          auVar27._24_4_ = (int)auVar26._24_4_;
          auVar27._28_4_ = (int)auVar26._28_4_;
          auVar28 = vpslld_avx(auVar21,0x17);
          auVar21 = vpslld_avx(auVar27._16_16_,0x17);
          auVar21 = vpaddd_avx(auVar21,auVar30);
          auVar28 = vpaddd_avx(auVar28,auVar30);
          auVar26 = vmaxps_avx(ZEXT1632(ZEXT816(0) << 0x40),*pauVar10);
          auVar13._0_4_ =
               ((auVar33._0_4_ + fVar14 +
                fVar14 * fVar14 *
                (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                  0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5)) * auVar28._0_4_ + -1.0) *
               fVar11 + auVar26._0_4_;
          auVar13._4_4_ =
               ((auVar33._4_4_ + fVar15 +
                fVar15 * fVar15 *
                (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                  0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar28._4_4_ + -1.0) *
               fVar11 + auVar26._4_4_;
          auVar13._8_4_ =
               ((auVar33._8_4_ + fVar16 +
                fVar16 * fVar16 *
                (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                  0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar28._8_4_ + -1.0) *
               fVar11 + auVar26._8_4_;
          auVar13._12_4_ =
               ((auVar33._12_4_ + fVar17 +
                fVar17 * fVar17 *
                (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                  0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar28._12_4_ + -1.0) *
               fVar11 + auVar26._12_4_;
          auVar13._16_4_ =
               ((auVar33._16_4_ + fVar18 +
                fVar18 * fVar18 *
                (((((fVar18 * 0.00019875691 + 0.0013981999) * fVar18 + 0.008333452) * fVar18 +
                  0.041665796) * fVar18 + 0.16666666) * fVar18 + 0.5)) * auVar21._0_4_ + -1.0) *
               fVar11 + auVar26._16_4_;
          auVar13._20_4_ =
               ((auVar33._20_4_ + fVar19 +
                fVar19 * fVar19 *
                (((((fVar19 * 0.00019875691 + 0.0013981999) * fVar19 + 0.008333452) * fVar19 +
                  0.041665796) * fVar19 + 0.16666666) * fVar19 + 0.5)) * auVar21._4_4_ + -1.0) *
               fVar11 + auVar26._20_4_;
          auVar13._24_4_ =
               ((auVar33._24_4_ + fVar20 +
                fVar20 * fVar20 *
                (((((fVar20 * 0.00019875691 + 0.0013981999) * fVar20 + 0.008333452) * fVar20 +
                  0.041665796) * fVar20 + 0.16666666) * fVar20 + 0.5)) * auVar21._8_4_ + -1.0) *
               fVar11 + auVar26._24_4_;
          auVar13._28_4_ =
               auVar33._28_4_ + auVar24._28_4_ + -0.6931472 + -0.6931472 + -1.0 + auVar26._28_4_;
          *pauVar10 = auVar13;
          pauVar10 = pauVar10 + 1;
          iVar4 = iVar4 + 8;
        } while (iVar4 < (int)uVar8);
        auVar32 = ZEXT464(0) << 0x40;
        uVar6 = uVar8 & 0xfffffff8;
      }
      auVar28._8_4_ = 0x42b0c0a5;
      auVar28._0_8_ = 0x42b0c0a542b0c0a5;
      auVar28._12_4_ = 0x42b0c0a5;
      auVar34._8_4_ = 0xc2b0c0a5;
      auVar34._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar34._12_4_ = 0xc2b0c0a5;
      if ((int)(uVar6 | 3) < (int)uVar8) {
        fVar11 = *(float *)(&this->field_0xd0 + (long)pp_Var2[-3]);
        uVar5 = uVar6;
        do {
          auVar21 = vminps_avx(auVar32._0_16_,*(undefined1 (*) [16])*pauVar10);
          auVar21 = vminps_avx(auVar21,auVar28);
          auVar12 = vmaxps_avx(auVar34,auVar21);
          auVar22._0_4_ = auVar12._0_4_ * 1.442695 + 0.5;
          auVar22._4_4_ = auVar12._4_4_ * 1.442695 + 0.5;
          auVar22._8_4_ = auVar12._8_4_ * 1.442695 + 0.5;
          auVar22._12_4_ = auVar12._12_4_ * 1.442695 + 0.5;
          auVar29._0_4_ = (int)auVar22._0_4_;
          auVar29._4_4_ = (int)auVar22._4_4_;
          auVar29._8_4_ = (int)auVar22._8_4_;
          auVar29._12_4_ = (int)auVar22._12_4_;
          auVar23 = vcvtdq2ps_avx(auVar29);
          auVar21 = vcmpps_avx(auVar22,auVar23,1);
          auVar21 = vandps_avx(auVar21,auVar30);
          auVar21 = vsubps_avx(auVar23,auVar21);
          fVar14 = auVar12._0_4_ + auVar21._0_4_ * -0.6931472;
          fVar15 = auVar12._4_4_ + auVar21._4_4_ * -0.6931472;
          fVar16 = auVar12._8_4_ + auVar21._8_4_ * -0.6931472;
          fVar17 = auVar12._12_4_ + auVar21._12_4_ * -0.6931472;
          auVar23._0_4_ = (int)auVar21._0_4_;
          auVar23._4_4_ = (int)auVar21._4_4_;
          auVar23._8_4_ = (int)auVar21._8_4_;
          auVar23._12_4_ = (int)auVar21._12_4_;
          auVar21 = vpslld_avx(auVar23,0x17);
          auVar23 = vpaddd_avx(auVar21,auVar30);
          auVar21 = vmaxps_avx(auVar32._0_16_,*(undefined1 (*) [16])*pauVar10);
          auVar12._0_4_ =
               ((fVar14 + auVar31._0_4_ +
                fVar14 * fVar14 *
                (((((fVar14 * 0.00019875691 + 0.0013981999) * fVar14 + 0.008333452) * fVar14 +
                  0.041665796) * fVar14 + 0.16666666) * fVar14 + 0.5)) * auVar23._0_4_ + -1.0) *
               fVar11 + auVar21._0_4_;
          auVar12._4_4_ =
               ((fVar15 + auVar31._4_4_ +
                fVar15 * fVar15 *
                (((((fVar15 * 0.00019875691 + 0.0013981999) * fVar15 + 0.008333452) * fVar15 +
                  0.041665796) * fVar15 + 0.16666666) * fVar15 + 0.5)) * auVar23._4_4_ + -1.0) *
               fVar11 + auVar21._4_4_;
          auVar12._8_4_ =
               ((fVar16 + auVar31._8_4_ +
                fVar16 * fVar16 *
                (((((fVar16 * 0.00019875691 + 0.0013981999) * fVar16 + 0.008333452) * fVar16 +
                  0.041665796) * fVar16 + 0.16666666) * fVar16 + 0.5)) * auVar23._8_4_ + -1.0) *
               fVar11 + auVar21._8_4_;
          auVar12._12_4_ =
               ((fVar17 + auVar31._12_4_ +
                fVar17 * fVar17 *
                (((((fVar17 * 0.00019875691 + 0.0013981999) * fVar17 + 0.008333452) * fVar17 +
                  0.041665796) * fVar17 + 0.16666666) * fVar17 + 0.5)) * auVar23._12_4_ + -1.0) *
               fVar11 + auVar21._12_4_;
          *(undefined1 (*) [16])*pauVar10 = auVar12;
          pauVar10 = (undefined1 (*) [32])(*pauVar10 + 0x10);
          uVar6 = uVar5 + 4;
          iVar4 = uVar5 + 7;
          uVar5 = uVar6;
        } while (iVar4 < (int)uVar8);
      }
      if (uVar8 - uVar6 != 0 && (int)uVar6 <= (int)uVar8) {
        lVar9 = 0;
        do {
          if (*(float *)(*pauVar10 + lVar9 * 4) < 0.0) {
            p_Var3 = pp_Var2[-3];
            fVar11 = expf(*(float *)(*pauVar10 + lVar9 * 4));
            auVar32 = ZEXT1664(ZEXT816(0) << 0x40);
            auVar31 = ZEXT1664(CONCAT412(0x3f800000,CONCAT48(0x3f800000,0x3f8000003f800000)));
            auVar33 = ZEXT3264(CONCAT428(0x3f800000,
                                         CONCAT424(0x3f800000,
                                                   CONCAT420(0x3f800000,
                                                             CONCAT416(0x3f800000,
                                                                       CONCAT412(0x3f800000,
                                                                                 CONCAT48(0x3f800000
                                                                                          ,
                                                  0x3f8000003f800000)))))));
            *(float *)(*pauVar10 + lVar9 * 4) =
                 (fVar11 + -1.0) * *(float *)(&this->field_0xd0 + (long)p_Var3);
          }
          lVar9 = lVar9 + 1;
        } while (uVar8 - uVar6 != (int)lVar9);
      }
      lVar7 = lVar7 + 1;
    } while (lVar7 != iVar1);
  }
  return 0;
}

Assistant:

int ELU_x86_avx::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int elempack = bottom_top_blob.elempack;
    int size = w * h * elempack;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        float* ptr = bottom_top_blob.channel(q);

        int i = 0;

#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _alpha512 = _mm512_set1_ps(alpha);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            _mm512_storeu_ps(ptr, elu_avx512(_p, _alpha512));

            ptr += 16;
        }
#endif // __AVX512F__
        __m256 _alpha256 = _mm256_set1_ps(alpha);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            _mm256_storeu_ps(ptr, elu_avx(_p, _alpha256));

            ptr += 8;
        }
#endif // __AVX__
        __m128 _alpha128 = _mm_set1_ps(alpha);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            _mm_store_ps(ptr, elu_sse(_p, _alpha128));

            ptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            if (*ptr < 0.f)
                *ptr = alpha * (expf(*ptr) - 1.f);
            ptr++;
        }
    }

    return 0;
}